

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

reverse_iterator * __thiscall llvm::sys::path::reverse_iterator::operator++(reverse_iterator *this)

{
  ulong uVar1;
  anon_unknown_dwarf_2b840c *this_00;
  size_t sVar2;
  size_t sVar3;
  Style in_ECX;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  StringRef str;
  StringRef str_00;
  
  str.Length._0_4_ = this->S;
  str.Data = (char *)(this->Path).Length;
  str.Length._4_4_ = 0;
  sVar2 = anon_unknown.dwarf_2b840c::root_dir_start
                    ((anon_unknown_dwarf_2b840c *)(this->Path).Data,str,in_ECX);
  uVar1 = this->Position;
  this_00 = (anon_unknown_dwarf_2b840c *)(this->Path).Data;
  uVar4 = (this->Path).Length;
  if (uVar1 != 0) {
    uVar5 = uVar1;
    do {
      uVar6 = sVar2 + 1;
      if (sVar2 + 1 == uVar5) goto LAB_0015723b;
      if (uVar4 <= uVar1 - 1) {
        __assert_fail("Index < Length && \"Invalid index!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                      ,0xef,"char llvm::StringRef::operator[](size_t) const");
      }
      if ((this_00[uVar5 - 1] != (anon_unknown_dwarf_2b840c)0x2f) &&
         (uVar6 = uVar5, this_00[uVar5 - 1] != (anon_unknown_dwarf_2b840c)0x5c || this->S != windows
         )) goto LAB_0015723b;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  uVar6 = 0;
LAB_0015723b:
  if (((uVar4 == 0 || uVar1 != uVar4) ||
      ((this_00[uVar1 - 1] != (anon_unknown_dwarf_2b840c)0x2f &&
       ((this_00[uVar1 - 1] != (anon_unknown_dwarf_2b840c)0x5c || (this->S != windows)))))) ||
     ((sVar2 != 0xffffffffffffffff && (uVar6 - 1 <= sVar2)))) {
    if (uVar6 <= uVar4) {
      uVar4 = uVar6;
    }
    str_00.Length._0_4_ = this->S;
    str_00.Data = (char *)uVar4;
    str_00.Length._4_4_ = 0;
    sVar3 = anon_unknown.dwarf_2b840c::filename_pos(this_00,str_00,(Style)uVar1);
    uVar1 = (this->Path).Length;
    sVar2 = sVar3;
    if (uVar1 < sVar3) {
      sVar2 = uVar1;
    }
    uVar4 = uVar6;
    if (uVar6 < sVar2) {
      uVar4 = sVar2;
    }
    if (uVar1 < uVar6) {
      uVar4 = uVar1;
    }
    (this->Component).Data = (this->Path).Data + sVar2;
    (this->Component).Length = uVar4 - sVar2;
    this->Position = sVar3;
  }
  else {
    this->Position = uVar1 - 1;
    (this->Component).Data = ".";
    (this->Component).Length = 1;
  }
  return this;
}

Assistant:

reverse_iterator &reverse_iterator::operator++() {
  size_t root_dir_pos = root_dir_start(Path, S);

  // Skip separators unless it's the root directory.
  size_t end_pos = Position;
  while (end_pos > 0 && (end_pos - 1) != root_dir_pos &&
         is_separator(Path[end_pos - 1], S))
    --end_pos;

  // Treat trailing '/' as a '.', unless it is the root dir.
  if (Position == Path.size() && !Path.empty() &&
      is_separator(Path.back(), S) &&
      (root_dir_pos == StringRef::npos || end_pos - 1 > root_dir_pos)) {
    --Position;
    Component = ".";
    return *this;
  }

  // Find next separator.
  size_t start_pos = filename_pos(Path.substr(0, end_pos), S);
  Component = Path.slice(start_pos, end_pos);
  Position = start_pos;
  return *this;
}